

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

bool SaveDeviceMemory(path *fname,size_t start,size_t length)

{
  bool bVar1;
  char *badValueMessage;
  bool res;
  string local_48;
  FILE *local_28;
  FILE *ff;
  size_t length_local;
  size_t start_local;
  path *fname_local;
  
  ff = (FILE *)length;
  length_local = start;
  start_local = (size_t)fname;
  local_28 = (FILE *)SJ_fopen(fname,"wb");
  if (local_28 == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_48,(path *)start_local);
    badValueMessage = (char *)std::__cxx11::string::c_str();
    Error("opening file for write",badValueMessage,FATAL);
    std::__cxx11::string::~string((string *)&local_48);
  }
  bVar1 = SaveDeviceMemory((FILE *)local_28,length_local,(size_t)ff);
  fclose(local_28);
  return bVar1;
}

Assistant:

bool SaveDeviceMemory(const std::filesystem::path & fname, const size_t start, const size_t length) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) Error("opening file for write", fname.string().c_str(), FATAL);
	bool res = SaveDeviceMemory(ff, start, length);
	fclose(ff);
	return res;
}